

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_setup_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  uint *puVar1;
  _Bool _Var2;
  CURLcode CVar3;
  CURLcode result;
  cf_setup_ctx *ctx;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  puVar1 = (uint *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
LAB_00123ad4:
    if ((cf->next != (Curl_cfilter *)0x0) && ((cf->next->field_0x24 & 1) == 0)) {
      CVar3 = Curl_conn_cf_connect(cf->next,data,blocking,done);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      if ((*done & 1U) == 0) {
        return CURLE_OK;
      }
    }
    if (*puVar1 == 0) {
      CVar3 = cf_he_insert_after(cf,data,*(Curl_dns_entry **)(puVar1 + 2),puVar1[5]);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      *puVar1 = 1;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_00123ad4;
    }
    if ((*puVar1 < 2) && (((ulong)cf->conn->bits >> 1 & 1) != 0)) {
      CVar3 = Curl_cf_socks_proxy_insert_after(cf,data);
      if (CVar3 != CURLE_OK) {
        return CVar3;
      }
      *puVar1 = 2;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_00123ad4;
    }
    if ((*puVar1 < 3) && (((ulong)cf->conn->bits & 1) != 0)) {
      if (((((cf->conn->http_proxy).proxytype == '\x02') ||
           ((cf->conn->http_proxy).proxytype == '\x03')) &&
          (_Var2 = Curl_conn_is_ssl(cf->conn,cf->sockindex), !_Var2)) &&
         (CVar3 = Curl_cf_ssl_proxy_insert_after(cf,data), CVar3 != CURLE_OK)) {
        return CVar3;
      }
      if ((((ulong)cf->conn->bits >> 3 & 1) != 0) &&
         (CVar3 = Curl_cf_http_proxy_insert_after(cf,data), CVar3 != CURLE_OK)) {
        return CVar3;
      }
      *puVar1 = 3;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_00123ad4;
    }
    if (*puVar1 < 4) {
      if ((*(ulong *)&(data->set).field_0x8ca >> 0x2d & 1) != 0) {
        _Var2 = Curl_conn_is_ssl(cf->conn,cf->sockindex);
        if (_Var2) {
          Curl_failf(data,"haproxy protocol not support with SSL encryption in place (QUIC?)");
          return CURLE_UNSUPPORTED_PROTOCOL;
        }
        CVar3 = Curl_cf_haproxy_insert_after(cf,data);
        if (CVar3 != CURLE_OK) {
          return CVar3;
        }
      }
      *puVar1 = 4;
      if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_00123ad4;
    }
    if (4 < *puVar1) goto LAB_00123e64;
    if ((((puVar1[4] == 1) || ((puVar1[4] != 0 && ((cf->conn->handler->flags & 1) != 0)))) &&
        (_Var2 = Curl_conn_is_ssl(cf->conn,cf->sockindex), !_Var2)) &&
       (CVar3 = Curl_cf_ssl_insert_after(cf,data), CVar3 != CURLE_OK)) {
      return CVar3;
    }
    *puVar1 = 5;
    if ((cf->next == (Curl_cfilter *)0x0) || ((cf->next->field_0x24 & 1) == 0)) goto LAB_00123ad4;
LAB_00123e64:
    *puVar1 = 6;
    cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
    *done = true;
  }
  else {
    *done = true;
  }
  return CURLE_OK;
}

Assistant:

static CURLcode cf_setup_connect(struct Curl_cfilter *cf,
                                 struct Curl_easy *data,
                                 bool blocking, bool *done)
{
  struct cf_setup_ctx *ctx = cf->ctx;
  CURLcode result = CURLE_OK;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  /* connect current sub-chain */
connect_sub_chain:
  if(cf->next && !cf->next->connected) {
    result = Curl_conn_cf_connect(cf->next, data, blocking, done);
    if(result || !*done)
      return result;
  }

  if(ctx->state < CF_SETUP_CNNCT_EYEBALLS) {
    result = cf_he_insert_after(cf, data, ctx->remotehost, ctx->transport);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_EYEBALLS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  /* sub-chain connected, do we need to add more? */
#ifndef CURL_DISABLE_PROXY
  if(ctx->state < CF_SETUP_CNNCT_SOCKS && cf->conn->bits.socksproxy) {
    result = Curl_cf_socks_proxy_insert_after(cf, data);
    if(result)
      return result;
    ctx->state = CF_SETUP_CNNCT_SOCKS;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_HTTP_PROXY && cf->conn->bits.httpproxy) {
#ifdef USE_SSL
    if(IS_HTTPS_PROXY(cf->conn->http_proxy.proxytype)
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
      result = Curl_cf_ssl_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */

#if !defined(CURL_DISABLE_HTTP)
    if(cf->conn->bits.tunnel_proxy) {
      result = Curl_cf_http_proxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_HTTP */
    ctx->state = CF_SETUP_CNNCT_HTTP_PROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }
#endif /* !CURL_DISABLE_PROXY */

  if(ctx->state < CF_SETUP_CNNCT_HAPROXY) {
#if !defined(CURL_DISABLE_PROXY)
    if(data->set.haproxyprotocol) {
      if(Curl_conn_is_ssl(cf->conn, cf->sockindex)) {
        failf(data, "haproxy protocol not support with SSL "
              "encryption in place (QUIC?)");
        return CURLE_UNSUPPORTED_PROTOCOL;
      }
      result = Curl_cf_haproxy_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* !CURL_DISABLE_PROXY */
    ctx->state = CF_SETUP_CNNCT_HAPROXY;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  if(ctx->state < CF_SETUP_CNNCT_SSL) {
#ifdef USE_SSL
    if((ctx->ssl_mode == CURL_CF_SSL_ENABLE
        || (ctx->ssl_mode != CURL_CF_SSL_DISABLE
           && cf->conn->handler->flags & PROTOPT_SSL)) /* we want SSL */
       && !Curl_conn_is_ssl(cf->conn, cf->sockindex)) { /* it is missing */
      result = Curl_cf_ssl_insert_after(cf, data);
      if(result)
        return result;
    }
#endif /* USE_SSL */
    ctx->state = CF_SETUP_CNNCT_SSL;
    if(!cf->next || !cf->next->connected)
      goto connect_sub_chain;
  }

  ctx->state = CF_SETUP_DONE;
  cf->connected = TRUE;
  *done = TRUE;
  return CURLE_OK;
}